

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O0

void __thiscall
PenguinV_Image::ImageTemplate<short>::FunctionFacade::FunctionFacade(FunctionFacade *this)

{
  value_type *in_RDI;
  size_type in_stack_ffffffffffffffc8;
  vector<short_*(*)(unsigned_long),_std::allocator<short_*(*)(unsigned_long)>_>
  *in_stack_ffffffffffffffd0;
  vector<void_(*)(short_*,_short,_unsigned_long),_std::allocator<void_(*)(short_*,_short,_unsigned_long)>_>
  *this_00;
  
  std::vector<short_*(*)(unsigned_long),_std::allocator<short_*(*)(unsigned_long)>_>::vector
            ((vector<short_*(*)(unsigned_long),_std::allocator<short_*(*)(unsigned_long)>_> *)
             0x1a98d0);
  std::vector<void_(*)(short_*),_std::allocator<void_(*)(short_*)>_>::vector
            ((vector<void_(*)(short_*),_std::allocator<void_(*)(short_*)>_> *)0x1a98e3);
  std::
  vector<void_(*)(short_*,_short_*,_unsigned_long),_std::allocator<void_(*)(short_*,_short_*,_unsigned_long)>_>
  ::vector((vector<void_(*)(short_*,_short_*,_unsigned_long),_std::allocator<void_(*)(short_*,_short_*,_unsigned_long)>_>
            *)0x1a98f6);
  std::
  vector<void_(*)(short_*,_short,_unsigned_long),_std::allocator<void_(*)(short_*,_short,_unsigned_long)>_>
  ::vector((vector<void_(*)(short_*,_short,_unsigned_long),_std::allocator<void_(*)(short_*,_short,_unsigned_long)>_>
            *)0x1a9909);
  std::vector<short_*(*)(unsigned_long),_std::allocator<short_*(*)(unsigned_long)>_>::resize
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(value_type *)in_RDI);
  std::vector<void_(*)(short_*),_std::allocator<void_(*)(short_*)>_>::resize
            ((vector<void_(*)(short_*),_std::allocator<void_(*)(short_*)>_> *)
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(value_type *)in_RDI);
  this_00 = (vector<void_(*)(short_*,_short,_unsigned_long),_std::allocator<void_(*)(short_*,_short,_unsigned_long)>_>
             *)0x0;
  std::
  vector<void_(*)(short_*,_short_*,_unsigned_long),_std::allocator<void_(*)(short_*,_short_*,_unsigned_long)>_>
  ::resize((vector<void_(*)(short_*,_short_*,_unsigned_long),_std::allocator<void_(*)(short_*,_short_*,_unsigned_long)>_>
            *)0x0,in_stack_ffffffffffffffc8,in_RDI);
  std::
  vector<void_(*)(short_*,_short,_unsigned_long),_std::allocator<void_(*)(short_*,_short,_unsigned_long)>_>
  ::resize(this_00,0,(value_type *)in_RDI);
  return;
}

Assistant:

FunctionFacade()
            {
                _allocate  .resize( 256, nullptr );
                _deallocate.resize( 256, nullptr );
                _copy      .resize( 256, nullptr );
                _set       .resize( 256, nullptr );
            }